

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionObject.cpp
# Opt level: O1

char * __thiscall
cbtCollisionObject::serialize(cbtCollisionObject *this,void *dataBuffer,cbtSerializer *serializer)

{
  cbtBroadphaseProxy *pcVar1;
  int iVar2;
  cbtTransform *pcVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pcVar3 = &this->m_worldTransform;
  lVar5 = (long)dataBuffer + 0x20;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(cbtScalar *)(lVar5 + lVar7 * 4) = (pcVar3->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pcVar3 = (cbtTransform *)((pcVar3->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0xe;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x12);
  pcVar3 = &this->m_interpolationWorldTransform;
  lVar5 = (long)dataBuffer + 0x60;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(cbtScalar *)(lVar5 + lVar7 * 4) = (pcVar3->m_basis).m_el[0].m_floats[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
    pcVar3 = (cbtTransform *)((pcVar3->m_basis).m_el + 1);
  } while (lVar6 != 3);
  lVar5 = 0x1e;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x22);
  lVar5 = 0x22;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x26);
  lVar5 = 0x26;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2a);
  lVar5 = 0x2a;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar5 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2e);
  *(int *)((long)dataBuffer + 0xf8) = this->m_hasAnisotropicFriction;
  *(cbtScalar *)((long)dataBuffer + 0xd0) = this->m_contactProcessingThreshold;
  *(undefined8 *)dataBuffer = 0;
  uVar4 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_collisionShape);
  *(undefined8 *)((long)dataBuffer + 8) = uVar4;
  *(undefined8 *)((long)dataBuffer + 0x10) = 0;
  *(int *)((long)dataBuffer + 0xfc) = this->m_collisionFlags;
  *(int *)((long)dataBuffer + 0x100) = this->m_islandTag1;
  *(int *)((long)dataBuffer + 0x104) = this->m_companionId;
  *(int *)((long)dataBuffer + 0x108) = this->m_activationState1;
  *(cbtScalar *)((long)dataBuffer + 0xd4) = this->m_deactivationTime;
  *(cbtScalar *)((long)dataBuffer + 0xd8) = this->m_friction;
  *(cbtScalar *)((long)dataBuffer + 0xdc) = this->m_rollingFriction;
  *(cbtScalar *)((long)dataBuffer + 0xe0) = this->m_contactDamping;
  *(cbtScalar *)((long)dataBuffer + 0xe4) = this->m_contactStiffness;
  *(cbtScalar *)((long)dataBuffer + 0xe8) = this->m_restitution;
  *(int *)((long)dataBuffer + 0x10c) = this->m_internalType;
  uVar4 = (**(code **)(*(long *)serializer + 0x50))(serializer,this);
  lVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,uVar4);
  *(long *)((long)dataBuffer + 0x18) = lVar5;
  if (lVar5 != 0) {
    (**(code **)(*(long *)serializer + 0x60))(serializer,uVar4);
  }
  *(cbtScalar *)((long)dataBuffer + 0xec) = this->m_hitFraction;
  *(cbtScalar *)((long)dataBuffer + 0xf0) = this->m_ccdSweptSphereRadius;
  *(cbtScalar *)((long)dataBuffer + 0xf4) = this->m_ccdMotionThreshold;
  *(int *)((long)dataBuffer + 0x110) = this->m_checkCollideWith;
  pcVar1 = this->m_broadphaseHandle;
  if (pcVar1 == (cbtBroadphaseProxy *)0x0) {
    *(undefined8 *)((long)dataBuffer + 0x114) = 0;
    iVar2 = -1;
  }
  else {
    *(int *)((long)dataBuffer + 0x114) = pcVar1->m_collisionFilterGroup;
    *(int *)((long)dataBuffer + 0x118) = pcVar1->m_collisionFilterMask;
    iVar2 = pcVar1->m_uniqueId;
  }
  *(int *)((long)dataBuffer + 0x11c) = iVar2;
  return "cbtCollisionObjectFloatData";
}

Assistant:

const char* cbtCollisionObject::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtCollisionObjectData* dataOut = (cbtCollisionObjectData*)dataBuffer;

	m_worldTransform.serialize(dataOut->m_worldTransform);
	m_interpolationWorldTransform.serialize(dataOut->m_interpolationWorldTransform);
	m_interpolationLinearVelocity.serialize(dataOut->m_interpolationLinearVelocity);
	m_interpolationAngularVelocity.serialize(dataOut->m_interpolationAngularVelocity);
	m_anisotropicFriction.serialize(dataOut->m_anisotropicFriction);
	dataOut->m_hasAnisotropicFriction = m_hasAnisotropicFriction;
	dataOut->m_contactProcessingThreshold = m_contactProcessingThreshold;
	dataOut->m_broadphaseHandle = 0;
	dataOut->m_collisionShape = serializer->getUniquePointer(m_collisionShape);
	dataOut->m_rootCollisionShape = 0;  //@todo
	dataOut->m_collisionFlags = m_collisionFlags;
	dataOut->m_islandTag1 = m_islandTag1;
	dataOut->m_companionId = m_companionId;
	dataOut->m_activationState1 = m_activationState1;
	dataOut->m_deactivationTime = m_deactivationTime;
	dataOut->m_friction = m_friction;
	dataOut->m_rollingFriction = m_rollingFriction;
	dataOut->m_contactDamping = m_contactDamping;
	dataOut->m_contactStiffness = m_contactStiffness;
	dataOut->m_restitution = m_restitution;
	dataOut->m_internalType = m_internalType;

	char* name = (char*)serializer->findNameForPointer(this);
	dataOut->m_name = (char*)serializer->getUniquePointer(name);
	if (dataOut->m_name)
	{
		serializer->serializeName(name);
	}
	dataOut->m_hitFraction = m_hitFraction;
	dataOut->m_ccdSweptSphereRadius = m_ccdSweptSphereRadius;
	dataOut->m_ccdMotionThreshold = m_ccdMotionThreshold;
	dataOut->m_checkCollideWith = m_checkCollideWith;
	if (m_broadphaseHandle)
	{
		dataOut->m_collisionFilterGroup = m_broadphaseHandle->m_collisionFilterGroup;
		dataOut->m_collisionFilterMask = m_broadphaseHandle->m_collisionFilterMask;
		dataOut->m_uniqueId = m_broadphaseHandle->m_uniqueId;
	}
	else
	{
		dataOut->m_collisionFilterGroup = 0;
		dataOut->m_collisionFilterMask = 0;
		dataOut->m_uniqueId = -1;
	}
	return cbtCollisionObjectDataName;
}